

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O1

void helics::generateMinTimeImplementation
               (TimeData *mTime,DependencyInfo *dep,GlobalFederateId ignore,int32_t sequenceCode)

{
  TimeState TVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  int32_t iVar6;
  bool bVar7;
  long lVar8;
  
  TVar1 = (dep->super_TimeData).mTimeState;
  iVar4 = (dep->fedID).gid;
  if (TVar1 < time_granted) {
    if (iVar4 == ignore.gid) {
      return;
    }
    if (TVar1 < mTime->mTimeState) {
      (mTime->minFed).gid = iVar4;
      mTime->mTimeState = TVar1;
      mTime->delayedTiming = (dep->super_TimeData).delayedTiming;
      mTime->restrictionLevel = (dep->super_TimeData).restrictionLevel;
      iVar6 = (dep->super_TimeData).responseSequenceCounter;
      mTime->sequenceCounter = (dep->super_TimeData).sequenceCounter;
      mTime->responseSequenceCounter = iVar6;
    }
    else {
      if (TVar1 != mTime->mTimeState) goto LAB_0035fa12;
      bVar2 = (dep->super_TimeData).restrictionLevel;
      bVar3 = mTime->restrictionLevel;
      if (bVar3 <= bVar2) {
        if (bVar2 == bVar3) {
          bVar7 = (dep->super_TimeData).interrupted;
          if (bVar7 == mTime->interrupted) {
            if ((bVar2 == bVar3) && (iVar4 < (mTime->minFed).gid)) {
              (mTime->minFed).gid = iVar4;
              mTime->delayedTiming = (dep->super_TimeData).delayedTiming;
              mTime->sequenceCounter = (dep->super_TimeData).sequenceCounter;
              mTime->responseSequenceCounter = (dep->super_TimeData).sequenceCounter;
            }
          }
          else if (bVar7 == false) {
            (mTime->minFed).gid = iVar4;
            mTime->delayedTiming = (dep->super_TimeData).delayedTiming;
            mTime->restrictionLevel = bVar2;
            mTime->sequenceCounter = (dep->super_TimeData).sequenceCounter;
            mTime->responseSequenceCounter = (dep->super_TimeData).sequenceCounter;
            mTime->interrupted = false;
          }
        }
        goto LAB_0035fa12;
      }
      (mTime->minFed).gid = iVar4;
      mTime->delayedTiming = (dep->super_TimeData).delayedTiming;
      mTime->restrictionLevel = bVar2;
      mTime->sequenceCounter = (dep->super_TimeData).sequenceCounter;
      mTime->responseSequenceCounter = (dep->super_TimeData).sequenceCounter;
    }
    mTime->interrupted = (dep->super_TimeData).interrupted;
LAB_0035fa12:
    (mTime->next).internalTimeCode = -1;
    (mTime->Te).internalTimeCode = 0;
    (mTime->minDe).internalTimeCode = 0;
    return;
  }
  if (iVar4 == ignore.gid) {
    if (iVar4 < 0x70000000 && iVar4 != 1) {
      return;
    }
    lVar8 = (dep->super_TimeData).Te.internalTimeCode;
    if ((mTime->minDe).internalTimeCode <= lVar8) {
      return;
    }
    (mTime->minDe).internalTimeCode = lVar8;
    return;
  }
  if ((dep->connection == SELF) ||
     ((((sequenceCode != 0 && ((dep->super_TimeData).responseSequenceCounter != sequenceCode)) &&
       ((dep->super_TimeData).timingVersion != '\0')) && (dep->dependent != false)))) {
    if (((dep->super_TimeData).responseSequenceCounter == sequenceCode) && (dep->dependent == true))
    {
      lVar8 = (dep->super_TimeData).minDe.internalTimeCode;
      if (lVar8 < (dep->super_TimeData).next.internalTimeCode) goto LAB_0035f92e;
    }
    else {
      lVar8 = (dep->super_TimeData).next.internalTimeCode;
    }
LAB_0035f924:
    if (lVar8 < (mTime->minDe).internalTimeCode) {
      (mTime->minDe).internalTimeCode = lVar8;
    }
  }
  else {
    lVar8 = (dep->super_TimeData).minDe.internalTimeCode;
    if ((dep->super_TimeData).next.internalTimeCode <= lVar8) goto LAB_0035f924;
    (mTime->minDe).internalTimeCode = -1000000000;
  }
LAB_0035f92e:
  lVar8 = (dep->super_TimeData).next.internalTimeCode;
  lVar5 = (mTime->next).internalTimeCode;
  if (lVar8 < lVar5) {
    (mTime->next).internalTimeCode = lVar8;
    mTime->mTimeState = TVar1;
    if (((dep->super_TimeData).responseSequenceCounter != sequenceCode) || (dep->dependent != true))
    goto LAB_0035f99d;
    bVar7 = (dep->super_TimeData).interrupted;
  }
  else {
    if (lVar8 != lVar5) goto LAB_0035f9a2;
    if (TVar1 == time_granted) {
      mTime->mTimeState = time_granted;
    }
    else if ((dep->super_TimeData).interrupted != false) goto LAB_0035f9a2;
LAB_0035f99d:
    bVar7 = false;
  }
  mTime->interrupted = bVar7;
LAB_0035f9a2:
  lVar8 = (mTime->Te).internalTimeCode;
  lVar5 = (dep->super_TimeData).Te.internalTimeCode;
  if (lVar8 <= lVar5) {
    if (lVar5 == lVar8) {
      (mTime->minFed).gid = -2010000000;
      (mTime->TeAlt).internalTimeCode = lVar8;
    }
    return;
  }
  (mTime->TeAlt).internalTimeCode = lVar8;
  (mTime->Te).internalTimeCode = (dep->super_TimeData).Te.internalTimeCode;
  (mTime->minFed).gid = iVar4;
  mTime->sequenceCounter = (dep->super_TimeData).sequenceCounter;
  mTime->responseSequenceCounter = (dep->super_TimeData).sequenceCounter;
  iVar4 = (dep->super_TimeData).minFed.gid;
  if ((iVar4 != -2010000000) && (iVar4 != -1700000000)) {
    (mTime->minFedActual).gid = iVar4;
    return;
  }
  (mTime->minFed).gid = (dep->fedID).gid;
  return;
}

Assistant:

static void generateMinTimeImplementation(TimeData& mTime,
                                          const DependencyInfo& dep,
                                          GlobalFederateId ignore,
                                          std::int32_t sequenceCode)
{
    if (dep.mTimeState < TimeState::time_granted) {
        if (dep.fedID == ignore) {
            return;
        }
        if (dep.mTimeState < mTime.mTimeState) {
            mTime.minFed = dep.fedID;
            mTime.mTimeState = dep.mTimeState;
            mTime.delayedTiming = dep.delayedTiming;
            mTime.restrictionLevel = dep.restrictionLevel;
            mTime.sequenceCounter = dep.sequenceCounter;
            mTime.responseSequenceCounter = dep.responseSequenceCounter;
            mTime.interrupted = dep.interrupted;
        } else if (dep.mTimeState == mTime.mTimeState) {
            if (dep.restrictionLevel < mTime.restrictionLevel) {
                mTime.minFed = dep.fedID;
                mTime.delayedTiming = dep.delayedTiming;
                mTime.restrictionLevel = dep.restrictionLevel;
                mTime.sequenceCounter = dep.sequenceCounter;
                mTime.responseSequenceCounter = dep.sequenceCounter;
                mTime.interrupted = dep.interrupted;
            } else if (dep.restrictionLevel == mTime.restrictionLevel &&
                       dep.interrupted != mTime.interrupted) {
                if (!dep.interrupted) {
                    mTime.minFed = dep.fedID;
                    mTime.delayedTiming = dep.delayedTiming;
                    mTime.restrictionLevel = dep.restrictionLevel;
                    mTime.sequenceCounter = dep.sequenceCounter;
                    mTime.responseSequenceCounter = dep.sequenceCounter;
                    mTime.interrupted = false;
                }
            } else if (dep.restrictionLevel == mTime.restrictionLevel && dep.fedID < mTime.minFed) {
                mTime.minFed = dep.fedID;
                mTime.delayedTiming = dep.delayedTiming;
                mTime.sequenceCounter = dep.sequenceCounter;
                mTime.responseSequenceCounter = dep.sequenceCounter;
            }
        }
        mTime.next = initializationTime;
        mTime.Te = timeZero;
        mTime.minDe = timeZero;
        return;
    }

    if (dep.fedID == ignore) {
        if (dep.fedID.isBroker()) {
            if (dep.Te < mTime.minDe) {
                mTime.minDe = dep.Te;
            }
        }

        return;
    }

    if (dep.connection != ConnectionType::SELF &&
        (sequenceCode == 0 || dep.responseSequenceCounter == sequenceCode ||
         dep.timingVersion == 0 || !dep.dependent)) {
        if (dep.minDe >= dep.next) {
            if (dep.minDe < mTime.minDe) {
                mTime.minDe = dep.minDe;
            }
        } else {
            // this minimum dependent event time received was invalid and can't be trusted
            // therefore it can't be used to determine a time grant
            mTime.minDe = -1;
        }
    } else if (dep.responseSequenceCounter == sequenceCode && dep.dependent) {
        if (dep.minDe >= dep.next && dep.minDe < mTime.minDe) {
            mTime.minDe = dep.minDe;
        }
    } else {
        if (dep.next < mTime.minDe) {
            mTime.minDe = dep.next;
        }
    }
    if (dep.next < mTime.next) {
        mTime.next = dep.next;
        mTime.mTimeState = dep.mTimeState;
        if (dep.responseSequenceCounter == sequenceCode && dep.dependent) {
            mTime.interrupted = dep.interrupted;
        } else {
            mTime.interrupted = false;
        }
    } else if (dep.next == mTime.next) {
        if (dep.mTimeState == TimeState::time_granted) {
            mTime.mTimeState = dep.mTimeState;
            mTime.interrupted = false;
        } else if (!dep.interrupted) {
            mTime.interrupted = false;
        }
    }
    // if (dep.connection != ConnectionType::self) {
    if (dep.Te < mTime.Te) {
        mTime.TeAlt = mTime.Te;
        mTime.Te = dep.Te;
        mTime.minFed = dep.fedID;
        mTime.sequenceCounter = dep.sequenceCounter;
        mTime.responseSequenceCounter = dep.sequenceCounter;

        if (dep.minFed.isValid()) {
            mTime.minFedActual = dep.minFed;
        } else {
            mTime.minFed = dep.fedID;
        }
    } else if (dep.Te == mTime.Te) {
        mTime.minFed = GlobalFederateId{};
        mTime.TeAlt = mTime.Te;
    }
    // }
}